

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

Fl_Type * __thiscall Fl_Widget_Type::make(Fl_Widget_Type *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar2;
  bool bVar3;
  Fl_Widget_Type *t;
  uint local_48;
  int H;
  int W;
  int Y;
  int X;
  int ULY;
  int ULX;
  int B;
  Fl_Widget_Type *p;
  Fl_Widget_Type *q;
  Fl_Type *qq;
  Fl_Widget_Type *this_local;
  
  q = (Fl_Widget_Type *)Fl_Type::current;
  while( true ) {
    bVar3 = false;
    if (q != (Fl_Widget_Type *)0x0) {
      iVar1 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])();
      bVar3 = true;
      if (iVar1 != 0) {
        iVar1 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1e])();
        bVar3 = iVar1 != 0;
      }
    }
    if (!bVar3) break;
    q = (Fl_Widget_Type *)(q->super_Fl_Type).parent;
  }
  if (q == (Fl_Widget_Type *)0x0) {
    fl_message("Please select a widget");
    this_local = (Fl_Widget_Type *)0x0;
  }
  else {
    _ULX = q;
    if (((force_parent != 0) || (iVar1 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x20])(), iVar1 == 0))
       && (iVar1 = (*((q->super_Fl_Type).parent)->_vptr_Fl_Type[0x17])(), iVar1 != 0)) {
      _ULX = (Fl_Widget_Type *)(q->super_Fl_Type).parent;
    }
    force_parent = 0;
    iVar1 = Fl_Widget::w(_ULX->o);
    ULY = iVar1 / 2;
    iVar1 = Fl_Widget::h(_ULX->o);
    if (iVar1 / 2 < ULY) {
      iVar1 = Fl_Widget::h(_ULX->o);
      ULY = iVar1 / 2;
    }
    if (0x19 < ULY) {
      ULY = 0x19;
    }
    iVar1 = (*(_ULX->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar1 == 0) {
      X = Fl_Widget::x(_ULX->o);
      Y = Fl_Widget::y(_ULX->o);
    }
    else {
      Y = 0;
      X = 0;
    }
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x20])();
    if (iVar1 == 0) {
      if (q == _ULX) {
        W = X + ULY;
        H = Y + ULY;
        t._4_4_ = ULY;
        local_48 = ULY;
      }
      else {
        local_48 = Fl_Widget::w(q->o);
        t._4_4_ = Fl_Widget::h(q->o);
        iVar1 = Fl_Widget::x(q->o);
        W = iVar1 + local_48;
        H = Fl_Widget::y(q->o);
        iVar1 = Fl_Widget::w(_ULX->o);
        if (X + iVar1 < (int)(W + local_48)) {
          W = Fl_Widget::x(q->o);
          iVar1 = Fl_Widget::y(q->o);
          H = iVar1 + t._4_4_;
          iVar1 = Fl_Widget::h(_ULX->o);
          if (Y + iVar1 < (int)(H + t._4_4_)) {
            H = Y + ULY;
          }
        }
      }
    }
    else {
      W = X + ULY;
      iVar1 = Fl_Widget::w(_ULX->o);
      local_48 = iVar1 - ULY;
      H = Y + ULY;
      iVar1 = Fl_Widget::h(_ULX->o);
      t._4_4_ = iVar1 - ULY;
    }
    if (1 < gridx) {
      W = (W / gridx) * gridx;
      local_48 = ((int)(local_48 - 1) / gridx + 1) * gridx;
    }
    if (1 < gridy) {
      H = (H / gridy) * gridy;
      t._4_4_ = ((int)(t._4_4_ - 1) / gridy + 1) * gridy;
    }
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2a])();
    this_local = (Fl_Widget_Type *)CONCAT44(extraout_var,iVar1);
    if (this->o == (Fl_Widget *)0x0) {
      iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])(this,0,0,100);
      this->o = (Fl_Widget *)CONCAT44(extraout_var_00,iVar1);
    }
    (this_local->super_Fl_Type).factory = &this->super_Fl_Type;
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])
                      (this,(ulong)(uint)W,(ulong)(uint)H,(ulong)local_48,(ulong)t._4_4_);
    this_local->o = (Fl_Widget *)CONCAT44(extraout_var_01,iVar1);
    if (reading_file == 0) {
      pcVar2 = Fl_Widget::label(this_local->o);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = Fl_Widget::label(this_local->o);
        Fl_Type::label((Fl_Type *)this_local,pcVar2);
      }
    }
    else {
      Fl_Widget::label(this_local->o,(char *)0x0);
    }
    Fl_Widget::user_data(this_local->o,this_local);
    Fl_Type::add((Fl_Type *)this_local,&_ULX->super_Fl_Type);
    redraw(this_local);
  }
  return &this_local->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_Widget_Type::make() {
  // Find the current widget, or widget to copy:
  Fl_Type *qq = Fl_Type::current;
  while (qq && (!qq->is_widget() || qq->is_menu_item())) qq = qq->parent;
  if (!qq) {
    fl_message("Please select a widget");
    return 0;
  }
  Fl_Widget_Type* q = (Fl_Widget_Type*)qq;
  // find the parent widget:
  Fl_Widget_Type* p = q;
  if ((force_parent || !p->is_group()) && p->parent->is_widget())
    p = (Fl_Widget_Type*)(p->parent);
  force_parent = 0;

  // Figure out a border between widget and window:
  int B = p->o->w()/2; if (p->o->h()/2 < B) B = p->o->h()/2; if (B>25) B = 25;

  int ULX,ULY; // parent's origin in window
  if (!p->is_window()) { // if it is a group, add corner
    ULX = p->o->x(); ULY = p->o->y();
  } else {
    ULX = ULY = 0;
  }

  // Figure out a position and size for the widget
  int X,Y,W,H;
  if (is_group()) {	// fill the parent with the widget
    X = ULX+B;
    W = p->o->w()-B;
    Y = ULY+B;
    H = p->o->h()-B;
  } else if (q != p) {	// copy position and size of current widget
    W = q->o->w();
    H = q->o->h();
    X = q->o->x()+W;
    Y = q->o->y();
    if (X+W > ULX+p->o->w()) {
      X = q->o->x();
      Y = q->o->y()+H;
      if (Y+H > ULY+p->o->h()) Y = ULY+B;
    }
  } else {	// just make it small and square...
    X = ULX+B;
    Y = ULY+B;
    W = H = B;
  }

  // satisfy the grid requirements (otherwise it edits really strangely):
  if (gridx>1) {
    X = (X/gridx)*gridx;
    W = ((W-1)/gridx+1)*gridx;
  }
  if (gridy>1) {
    Y = (Y/gridy)*gridy;
    H = ((H-1)/gridy+1)*gridy;
  }

  // Construct the Fl_Type:
  Fl_Widget_Type *t = _make();
  if (!o) o = widget(0,0,100,100); // create template widget
  t->factory = this;
  // Construct the Fl_Widget:
  t->o = widget(X,Y,W,H);
  if (reading_file) t->o->label(0);
  else if (t->o->label()) t->label(t->o->label()); // allow editing
  t->o->user_data((void*)t);
  // Put it in the parent:
  //  ((Fl_Group *)(p->o))->add(t->o); (done by Fl_Type::add())
  // add to browser:
  t->add(p);
  t->redraw();
  return t;
}